

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O1

w_status wp_token_scan_decimal_flt(w_tokenizer *tokenizer,w_token_id *id)

{
  byte bVar1;
  w_status wVar2;
  
  if (tokenizer == (w_tokenizer *)0x0) {
    w_handle_failed_assertion
              ("tokenizer != NULL","wp_token_scan_decimal_flt",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x1bd);
  }
  if (tokenizer->it == (char *)0x0) {
    w_handle_failed_assertion
              ("tokenizer->it != NULL","wp_token_scan_decimal_flt",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x1be);
  }
  if (tokenizer->it[-1] != '.' && 9 < (byte)(tokenizer->it[-1] - 0x30U)) {
    w_handle_failed_assertion
              ("(tokenizer->it[-1] >= \'0\' && tokenizer->it[-1] <= \'9\') || tokenizer->it[-1] == \'.\'"
               ,"wp_token_scan_decimal_flt",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x1c2);
  }
  if (id == (w_token_id *)0x0) {
    w_handle_failed_assertion
              ("id != NULL","wp_token_scan_decimal_flt",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x1c3);
  }
  wp_token_consume_decimal_digits(tokenizer);
  bVar1 = *tokenizer->it;
  if (((ulong)bVar1 < 0x30) && ((0xac0100000401U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
    *id = W_TOKEN_ID_FLT_DECIMAL;
    return W_SUCCESS;
  }
  if (bVar1 == 0x65) {
    tokenizer->it = tokenizer->it + 1;
    tokenizer->column = tokenizer->column + 1;
    wVar2 = wp_token_scan_flt_exponent(tokenizer,id,W_TOKEN_ID_FLT_DECIMAL);
    return wVar2;
  }
  wVar2 = wp_token_add_error(tokenizer,"not a valid decimal floating-point literal character");
  return wVar2;
}

Assistant:

static enum w_status
wp_token_scan_decimal_flt(
    struct w_tokenizer *tokenizer,
    enum w_token_id *id
)
{
    W_ASSERT(tokenizer != NULL);
    W_ASSERT(tokenizer->it != NULL);
    W_ASSERT(
        (tokenizer->it[-1] >= '0' && tokenizer->it[-1] <= '9')
        || tokenizer->it[-1] == '.'
    );
    W_ASSERT(id != NULL);

    wp_token_consume_decimal_digits(tokenizer);
    switch (*tokenizer->it)
    {
        case 'e':
        {
            wp_token_advance_iter(tokenizer);
            return wp_token_scan_flt_exponent(
                tokenizer, id, W_TOKEN_ID_FLT_DECIMAL
            );
        }
        case WP_TOKEN_CASE_VALID_FOLLOW_UP_TO_NUMBER_LITERAL:
        {
            *id = W_TOKEN_ID_FLT_DECIMAL;
            return W_SUCCESS;
        }
        default:
        {
            return wp_token_add_error(
                tokenizer,
                WP_TOKEN_GET_ERROR_MSG_INVALID_CHAR(
                    "decimal floating-point literal"
                )
            );
        }
    }
}